

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_io.cc
# Opt level: O0

void __thiscall
gimage::PNGImageIO::load
          (PNGImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  undefined1 auVar1 [16];
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this_00;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 uVar7;
  __jmp_buf_tag *__env;
  long *plVar8;
  int *piVar9;
  int in_ECX;
  long lVar10;
  char *in_RDX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  ulong in_stack_00000008;
  ulong in_stack_00000010;
  int d_2;
  long i_2;
  int j_2;
  long k_2;
  int d_1;
  long i_1;
  long j;
  store_t v;
  int d;
  int ii;
  long i;
  long j_1;
  int jj;
  long kk;
  long k_1;
  int rk;
  valarray<int> nline;
  valarray<int> vline;
  int k;
  int rn;
  int bits;
  int color;
  int depth;
  long height;
  long width;
  uchar **row;
  uchar *img;
  png_infop end;
  png_infop info;
  png_structp png;
  FILE *in;
  int *in_stack_fffffffffffffad8;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaec;
  valarray<int> *in_stack_fffffffffffffaf0;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffb00;
  string *in_stack_fffffffffffffb18;
  long k_00;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  int j_00;
  long in_stack_fffffffffffffb28;
  long in_stack_fffffffffffffb30;
  undefined7 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3f;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffb40;
  int local_3bc;
  long local_3b8;
  int local_3ac;
  long local_3a8;
  int local_39c;
  long local_398 [3];
  long local_380 [3];
  byte local_361;
  int local_360;
  int local_35c;
  long local_358 [3];
  long local_340 [3];
  long local_328;
  int local_31c;
  long local_318;
  undefined4 local_310;
  undefined4 local_30c;
  long local_308 [3];
  long local_2f0 [2];
  int local_2e0;
  undefined4 local_2dc;
  valarray<int> local_2d8;
  undefined4 local_2c4;
  valarray<int> local_2c0;
  int local_2ac;
  int local_2a8;
  undefined1 local_2a2;
  allocator local_2a1;
  string local_2a0 [100];
  uint local_23c;
  uint local_238;
  int local_234;
  ulong local_230;
  ulong local_228;
  undefined1 local_21a;
  allocator local_219;
  string local_218 [96];
  void *local_1b8;
  void *local_1b0;
  undefined1 local_1a2;
  allocator local_1a1;
  string local_1a0 [32];
  long local_180;
  undefined1 local_172;
  allocator local_171;
  string local_170 [32];
  long local_150;
  undefined1 local_142;
  allocator local_141;
  string local_140 [32];
  long local_120;
  undefined1 local_112;
  allocator local_111;
  string local_110 [96];
  FILE *local_b0;
  undefined1 local_a5;
  allocator local_91;
  string local_90 [96];
  long local_30;
  long local_28;
  int local_1c;
  char *local_18;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar6 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_RDX,1);
  if ((uVar6 & 1) == 0) {
    local_a5 = 1;
    uVar7 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,local_18,&local_91);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffae0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                   (char *)in_stack_fffffffffffffae0);
    gutil::IOException::IOException
              ((IOException *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
               in_stack_fffffffffffffb18);
    local_a5 = 0;
    __cxa_throw(uVar7,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_b0 = fopen(local_18,"rb");
  if (local_b0 == (FILE *)0x0) {
    local_112 = 1;
    uVar7 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,local_18,&local_111);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffae0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                   (char *)in_stack_fffffffffffffae0);
    gutil::IOException::IOException
              ((IOException *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
               in_stack_fffffffffffffb18);
    local_112 = 0;
    __cxa_throw(uVar7,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_120 = png_create_read_struct("1.6.37",0,0);
  if (local_120 == 0) {
    fclose(local_b0);
    local_142 = 1;
    uVar7 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_140,"Cannot allocate handle for reading PNG files",&local_141);
    gutil::IOException::IOException
              ((IOException *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
               in_stack_fffffffffffffb18);
    local_142 = 0;
    __cxa_throw(uVar7,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_150 = png_create_info_struct(local_120);
  if (local_150 == 0) {
    png_destroy_read_struct(&local_120,0);
    fclose(local_b0);
    local_172 = 1;
    uVar7 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_170,"Cannot allocate PNG info structure",&local_171);
    gutil::IOException::IOException
              ((IOException *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
               in_stack_fffffffffffffb18);
    local_172 = 0;
    __cxa_throw(uVar7,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_180 = png_create_info_struct(local_120);
  if (local_180 == 0) {
    png_destroy_read_struct(&local_120,&local_150,0);
    fclose(local_b0);
    local_1a2 = 1;
    uVar7 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"Cannot allocate PNG info structure",&local_1a1);
    gutil::IOException::IOException
              ((IOException *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
               in_stack_fffffffffffffb18);
    local_1a2 = 0;
    __cxa_throw(uVar7,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_1b0 = (void *)0x0;
  local_1b8 = (void *)0x0;
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_120,longjmp,200);
  iVar4 = _setjmp(__env);
  if (iVar4 != 0) {
    if (local_1b0 != (void *)0x0) {
      operator_delete__(local_1b0);
    }
    if (local_1b8 != (void *)0x0) {
      operator_delete__(local_1b8);
    }
    png_destroy_read_struct(&local_120,&local_150,&local_180);
    fclose(local_b0);
    local_21a = 1;
    uVar7 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_218,local_18,&local_219);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffae0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                   (char *)in_stack_fffffffffffffae0);
    gutil::IOException::IOException
              ((IOException *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
               in_stack_fffffffffffffb18);
    local_21a = 0;
    __cxa_throw(uVar7,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  png_init_io(local_120,local_b0);
  png_read_info(local_120,local_150);
  uVar5 = png_get_image_width(local_120,local_150);
  local_228 = (ulong)uVar5;
  uVar5 = png_get_image_height(local_120,local_150);
  local_230 = (ulong)uVar5;
  local_234 = 1;
  bVar2 = png_get_color_type(local_120,local_150);
  local_238 = (uint)bVar2;
  if (((local_238 == 3) || (local_238 == 2)) || (local_238 == 6)) {
    local_234 = 3;
  }
  if ((long)in_stack_00000008 < 0) {
    in_stack_00000008 = (long)(local_228 + (long)local_1c + -1) / (long)local_1c;
  }
  if ((long)in_stack_00000010 < 0) {
    in_stack_00000010 = (long)(local_230 + (long)local_1c + -1) / (long)local_1c;
  }
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (in_stack_fffffffffffffb40,CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38)
             ,in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::clear(in_stack_fffffffffffffb00);
  if (local_238 == 3) {
    png_set_palette_to_rgb(local_120);
  }
  bVar2 = png_get_bit_depth(local_120,local_150);
  local_23c = (uint)bVar2;
  if (8 < local_23c) {
    png_destroy_read_struct(&local_120,&local_150,&local_180);
    fclose(local_b0);
    local_2a2 = 1;
    uVar7 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a0,local_18,&local_2a1);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffae0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                   (char *)in_stack_fffffffffffffae0);
    gutil::IOException::IOException
              ((IOException *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
               in_stack_fffffffffffffb18);
    local_2a2 = 0;
    __cxa_throw(uVar7,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  if ((local_238 == 0) && (local_23c < 8)) {
    png_set_expand_gray_1_2_4_to_8(local_120);
  }
  if ((local_238 & 4) != 0) {
    png_set_strip_alpha(local_120);
  }
  png_read_update_info(local_120,local_150);
  local_2a8 = png_get_rowbytes(local_120,local_150);
  uVar6 = local_230 * (long)local_2a8;
  if ((long)uVar6 < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_1b0 = operator_new__(uVar6);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_230;
  uVar6 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_1b8 = operator_new__(uVar6);
  for (local_2ac = 0; (long)local_2ac < (long)local_230; local_2ac = local_2ac + 1) {
    *(long *)((long)local_1b8 + (long)local_2ac * 8) =
         (long)local_1b0 + (long)(local_2ac * local_2a8);
  }
  png_read_image(local_120,local_1b8);
  if (((local_1c < 2) && (local_28 == 0)) &&
     ((local_30 == 0 && ((in_stack_00000008 == local_228 && (in_stack_00000010 == local_230)))))) {
    for (local_3a8 = 0; local_3a8 < (long)local_230; local_3a8 = local_3a8 + 1) {
      local_3ac = 0;
      for (local_3b8 = 0; local_3b8 < (long)local_228; local_3b8 = local_3b8 + 1) {
        for (local_3bc = 0; local_3bc < local_234; local_3bc = local_3bc + 1) {
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                    (local_10,local_3b8,local_3a8,local_3bc,
                     *(store_t *)(*(long *)((long)local_1b8 + local_3a8 * 8) + (long)local_3ac));
          local_3ac = local_3ac + 1;
        }
      }
    }
  }
  else {
    local_2c4 = 0;
    std::valarray<int>::valarray
              (in_stack_fffffffffffffaf0,
               (int *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (size_t)in_stack_fffffffffffffae0);
    local_2dc = 0;
    std::valarray<int>::valarray
              (in_stack_fffffffffffffaf0,
               (int *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (size_t)in_stack_fffffffffffffae0);
    local_2f0[1] = 0;
    local_2f0[0] = local_30 * local_1c;
    plVar8 = std::max<long>(local_2f0 + 1,local_2f0);
    local_2e0 = (int)*plVar8;
    local_308[1] = 0;
    local_308[0] = -local_30;
    plVar8 = std::max<long>(local_308 + 1,local_308);
    for (local_308[2] = *plVar8;
        local_308[2] < (long)in_stack_00000010 &&
        (local_30 + local_308[2]) * (long)local_1c < (long)local_230;
        local_308[2] = local_308[2] + 1) {
      local_30c = 0;
      std::valarray<int>::operator=
                ((valarray<int> *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
      local_310 = 0;
      std::valarray<int>::operator=
                ((valarray<int> *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
      local_318 = 0;
      while( true ) {
        bVar3 = false;
        if (local_318 < local_1c) {
          bVar3 = local_318 + (local_30 + local_308[2]) * (long)local_1c < (long)local_230;
        }
        if (!bVar3) break;
        local_328 = 0;
        plVar8 = std::max<long>(&local_328,&local_28);
        local_31c = (int)*plVar8 * local_1c * local_234;
        local_340[1] = 0;
        local_340[0] = -local_28;
        plVar8 = std::max<long>(local_340 + 1,local_340);
        local_340[2] = *plVar8 * (long)local_234;
        local_358[1] = 0;
        local_358[0] = -local_28;
        plVar8 = std::max<long>(local_358 + 1,local_358);
        for (local_358[2] = *plVar8;
            local_358[2] < (long)in_stack_00000008 &&
            (local_28 + local_358[2]) * (long)local_1c < (long)local_228;
            local_358[2] = local_358[2] + 1) {
          local_35c = 0;
          while( true ) {
            bVar3 = false;
            if (local_35c < local_1c) {
              bVar3 = (local_28 + local_358[2]) * (long)local_1c + (long)local_35c < (long)local_228
              ;
            }
            if (!bVar3) break;
            for (local_360 = 0; local_360 < local_234; local_360 = local_360 + 1) {
              lVar10 = (long)local_31c;
              local_31c = local_31c + 1;
              local_361 = *(byte *)(*(long *)((long)local_1b8 + (long)local_2e0 * 8) + lVar10);
              bVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::isValidS
                                (in_stack_fffffffffffffae0,
                                 (store_t)((ulong)in_stack_fffffffffffffad8 >> 0x38));
              if (bVar3) {
                uVar5 = (uint)local_361;
                piVar9 = std::valarray<int>::operator[](&local_2c0,local_340[2] + local_360);
                *piVar9 = *piVar9 + uVar5;
                piVar9 = std::valarray<int>::operator[](&local_2d8,local_340[2] + local_360);
                *piVar9 = *piVar9 + 1;
              }
            }
            local_35c = local_35c + 1;
          }
          local_340[2] = local_234 + local_340[2];
        }
        local_2e0 = local_2e0 + 1;
        local_318 = local_318 + 1;
      }
      local_380[1] = 0;
      local_380[0] = -local_28;
      plVar8 = std::max<long>(local_380 + 1,local_380);
      local_380[2] = *plVar8 * (long)local_234;
      local_398[1] = 0;
      local_398[0] = -local_28;
      plVar8 = std::max<long>(local_398 + 1,local_398);
      for (local_398[2] = *plVar8;
          local_398[2] < (long)in_stack_00000008 &&
          (local_28 + local_398[2]) * (long)local_1c < (long)local_228;
          local_398[2] = local_398[2] + 1) {
        for (local_39c = 0; local_39c < local_234; local_39c = local_39c + 1) {
          piVar9 = std::valarray<int>::operator[](&local_2d8,local_380[2]);
          this_00 = local_10;
          lVar10 = local_398[2];
          if (0 < *piVar9) {
            k_00 = local_308[2];
            j_00 = local_39c;
            piVar9 = std::valarray<int>::operator[](&local_2c0,local_380[2]);
            iVar4 = *piVar9;
            piVar9 = std::valarray<int>::operator[](&local_2d8,local_380[2]);
            iVar4 = iVar4 + *piVar9 / 2;
            piVar9 = std::valarray<int>::operator[](&local_2d8,local_380[2]);
            Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                      (this_00,lVar10,k_00,j_00,(store_t)(iVar4 / *piVar9));
          }
          local_380[2] = local_380[2] + 1;
        }
      }
    }
    std::valarray<int>::~valarray((valarray<int> *)in_stack_fffffffffffffae0);
    std::valarray<int>::~valarray((valarray<int> *)in_stack_fffffffffffffae0);
  }
  if (local_1b8 != (void *)0x0) {
    operator_delete__(local_1b8);
  }
  if (local_1b0 != (void *)0x0) {
    operator_delete__(local_1b0);
  }
  png_destroy_read_struct(&local_120,&local_150,&local_180);
  fclose(local_b0);
  return;
}

Assistant:

void PNGImageIO::load(ImageU8 &image, const char *name, int ds, long x, long y,
                      long w, long h) const
{
  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNG image ("+std::string(name)+")");
  }

  // initialize reading a png file

  FILE *in=fopen(name, "rb");

  if (in == 0)
  {
    throw gutil::IOException("Cannot open file ("+std::string(name)+")");
  }

  png_structp png=png_create_read_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);

  if (png == 0)
  {
    fclose(in);
    throw gutil::IOException("Cannot allocate handle for reading PNG files");
  }

  png_infop info=png_create_info_struct(png);

  if (info == 0)
  {
    png_destroy_read_struct(&png, static_cast<png_infopp>(0), static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  png_infop end=png_create_info_struct(png);

  if (end == 0)
  {
    png_destroy_read_struct(&png, &info, static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  unsigned char *img=0;
  unsigned char **row=0;

  if (setjmp(png_jmpbuf(png)))
  {
    delete [] img;
    delete [] row;

    png_destroy_read_struct(&png, &info, &end);
    fclose(in);
    throw gutil::IOException("Cannot read PNG file ("+std::string(name)+")");
  }

  // read header data

  png_init_io(png, in);
  png_read_info(png, info);

  long width=static_cast<long>(png_get_image_width(png, info));
  long height=static_cast<long>(png_get_image_height(png, info));

  int depth=1;
  int color=png_get_color_type(png, info);

  if (color == PNG_COLOR_TYPE_PALETTE || color == PNG_COLOR_TYPE_RGB ||
      color == PNG_COLOR_TYPE_RGB_ALPHA)
  {
    depth=3;
  }

  // adapt size of image

  if (w < 0)
  {
    w=(width+ds-1)/ds;
  }

  if (h < 0)
  {
    h=(height+ds-1)/ds;
  }

  image.setSize(w, h, depth);
  image.clear();

  // transform palette images to RGB

  if (color == PNG_COLOR_TYPE_PALETTE)
  {
    png_set_palette_to_rgb(png);
  }

  // make sure that there are 8 Bits per color channel

  int bits=png_get_bit_depth(png, info);

  if (bits > 8)
  {
    png_destroy_read_struct(&png, &info, &end);
    fclose(in);
    throw gutil::IOException("PNG with <= 8 bits expected ("+std::string(name)+")");
  }

  if (color == PNG_COLOR_TYPE_GRAY && bits < 8)
  {
    png_set_expand_gray_1_2_4_to_8(png);
  }

  // strip alpha channel if available

  if ((color & PNG_COLOR_MASK_ALPHA) != 0)
  {
    png_set_strip_alpha(png);
  }

  png_read_update_info(png, info);

  // read image completely

  int rn=static_cast<int>(png_get_rowbytes(png, info));
  img=new unsigned char [height*rn];
  row=new unsigned char * [height];

  for (int k=0; k<height; k++)
  {
    row[k]=img+k*rn;
  }

  png_read_image(png, static_cast<png_bytepp>(row));

  // load downscaled part?

  if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
  {
    std::valarray<ImageU8::work_t> vline(0, w*depth);
    std::valarray<int> nline(0, w*depth);

    // skip the first y*ds image rows

    int rk=std::max(0l, y*ds);

    for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
    {
      // load downscaled line

      vline=0;
      nline=0;

      for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
      {
        int  jj=std::max(0l, x)*ds*depth;
        long j=std::max(0l, -x)*depth;

        for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
        {
          for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
          {
            for (int d=0; d<depth; d++)
            {
              ImageU8::store_t v=static_cast<ImageU8::store_t>(row[rk][jj++]);

              if (image.isValidS(v))
              {
                vline[j+d]+=v;
                nline[j+d]++;
              }
            }
          }

          j+=depth;
        }

        rk++;
      }

      // store line into image

      long j=std::max(0l, -x)*depth;

      for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          if (nline[j] > 0)
          {
            image.set(i, k, d, static_cast<ImageU8::store_t>((vline[j]+nline[j]/2)/nline[j]));
          }

          j++;
        }
      }
    }
  }
  else // load whole image
  {
    for (long k=0; k<height; k++)
    {
      int j=0;

      for (long i=0; i<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          image.set(i, k, d, static_cast<ImageU8::store_t>(row[k][j++]));
        }
      }
    }
  }

  // close data set

  delete [] row;
  delete [] img;

  png_destroy_read_struct(&png, &info, &end);
  fclose(in);
}